

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sink.hpp
# Opt level: O0

void __thiscall jsoncons::stream_sink<wchar_t>::~stream_sink(stream_sink<wchar_t> *this)

{
  basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *pbVar1;
  stream_sink<wchar_t> *in_RDI;
  vector<wchar_t,_std::allocator<wchar_t>_> *this_00;
  
  pbVar1 = in_RDI->stream_ptr_;
  this_00 = (vector<wchar_t,_std::allocator<wchar_t>_> *)in_RDI->begin_buffer_;
  buffer_length(in_RDI);
  std::wostream::write((wchar_t *)pbVar1,(long)this_00);
  std::wostream::flush();
  std::vector<wchar_t,_std::allocator<wchar_t>_>::~vector(this_00);
  return;
}

Assistant:

~stream_sink() noexcept
        {
            stream_ptr_->write(begin_buffer_, buffer_length());
            stream_ptr_->flush();
        }